

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Importer::ImportMaterials(glTF2Importer *this,Asset *r)

{
  aiScene *paVar1;
  aiMaterial **ppaVar2;
  aiMaterial *paVar3;
  ulong uVar4;
  uint i;
  ulong uVar5;
  Material defaultMaterial;
  Material local_1b0;
  
  uVar4 = (ulong)((long)(r->materials).mObjs.
                        super__Vector_base<glTF2::Material_*,_std::allocator<glTF2::Material_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(r->materials).mObjs.
                       super__Vector_base<glTF2::Material_*,_std::allocator<glTF2::Material_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  glTF2::Material::Material(&local_1b0);
  this->mScene->mNumMaterials = (int)uVar4 + 1;
  paVar1 = this->mScene;
  ppaVar2 = (aiMaterial **)operator_new__((ulong)paVar1->mNumMaterials << 3);
  paVar1->mMaterials = ppaVar2;
  paVar3 = ImportMaterial(&this->embeddedTexIdxs,r,&local_1b0);
  uVar4 = uVar4 & 0xffffffff;
  this->mScene->mMaterials[uVar4] = paVar3;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    paVar3 = ImportMaterial(&this->embeddedTexIdxs,r,
                            (r->materials).mObjs.
                            super__Vector_base<glTF2::Material_*,_std::allocator<glTF2::Material_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar5]);
    this->mScene->mMaterials[uVar5] = paVar3;
  }
  glTF2::Material::~Material(&local_1b0);
  return;
}

Assistant:

void glTF2Importer::ImportMaterials(glTF2::Asset& r)
{
    const unsigned int numImportedMaterials = unsigned(r.materials.Size());
    Material defaultMaterial;

    mScene->mNumMaterials = numImportedMaterials + 1;
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials];
    mScene->mMaterials[numImportedMaterials] = ImportMaterial(embeddedTexIdxs, r, defaultMaterial);

    for (unsigned int i = 0; i < numImportedMaterials; ++i) {
       mScene->mMaterials[i] = ImportMaterial(embeddedTexIdxs, r, r.materials[i]);
    }
}